

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::AsioBrokerServer::stopServer(AsioBrokerServer *this)

{
  string_view message;
  string_view message_00;
  element_type *this_00;
  mutex_type *in_RDI;
  lock_guard<std::mutex> tlock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  int local_18;
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_RDI);
  if ((in_RDI[4].super___mutex_base._M_mutex.__size[0x10] & 1U) != 0) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    message._M_str = (char *)in_stack_ffffffffffffffc0;
    message._M_len = (size_t)in_RDI;
    TypedBrokerServer::logMessage(message);
    this_00 = CLI::std::
              __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x202f0c);
    gmlc::networking::TcpServer::close(this_00,local_18);
  }
  if ((in_RDI[4].super___mutex_base._M_mutex.__size[0x11] & 1U) != 0) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    message_00._M_str = (char *)in_stack_ffffffffffffffc0;
    message_00._M_len = (size_t)in_RDI;
    TypedBrokerServer::logMessage(message_00);
    CLI::std::__shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x202f6e);
    udp::UdpServer::stop_receive((UdpServer *)0x202f76);
  }
  std::thread::join();
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x202f93);
  return;
}

Assistant:

void AsioBrokerServer::stopServer()
    {
        std::lock_guard<std::mutex> tlock(threadGuard);
        if (tcp_enabled_) {
#ifdef HELICS_ENABLE_TCP_CORE
            logMessage("stopping tcp broker server");
            tcpserver->close();
#endif
        }
        if (udp_enabled_) {
#ifdef HELICS_ENABLE_UDP_CORE
            logMessage("stopping udp broker server");
            udpserver->stop_receive();
#endif
        }
        mainLoopThread.join();
    }